

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

void __thiscall FloatInstance::FloatInstance(FloatInstance *this,float value)

{
  undefined8 *in_RDI;
  undefined4 in_XMM0_Da;
  string *in_stack_ffffffffffffffb8;
  Instance *in_stack_ffffffffffffffc0;
  allocator local_31;
  string local_30 [36];
  undefined4 local_c;
  
  local_c = in_XMM0_Da;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"Float",&local_31);
  Instance::Instance(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  *in_RDI = &PTR__FloatInstance_0020edc0;
  *(undefined4 *)(in_RDI + 0xb) = local_c;
  return;
}

Assistant:

FloatInstance::FloatInstance(float value) : Instance("Float") {
    _value = value;
}